

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  ushort uVar6;
  BYTE *s_1;
  ushort *puVar7;
  ushort *__src;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  ushort *puVar11;
  long lVar12;
  byte *pbVar13;
  byte *pbVar14;
  uint uVar15;
  int iVar16;
  BYTE *s;
  byte *pbVar17;
  ushort *puVar18;
  ushort *puVar19;
  ulong uVar20;
  BYTE *e;
  ulong uVar21;
  byte *__dest;
  byte *pbVar22;
  ulong uVar23;
  int local_58;
  int local_50;
  
  iVar16 = -1;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar16 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar14 = (byte *)(dest + -prefixSize);
      puVar1 = (ushort *)(source + compressedSize);
      pbVar2 = (byte *)(dest + maxOutputSize);
      puVar18 = (ushort *)source;
      __dest = (byte *)dest;
      if (maxOutputSize < 0x40) goto LAB_001c6217;
LAB_001c5ecd:
      while( true ) {
        __src = (ushort *)((long)puVar18 + 1);
        bVar3 = (byte)*puVar18;
        uVar23 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_001c6193;
          puVar11 = puVar18 + 1;
          uVar8 = 0;
          puVar18 = puVar18 + 8;
          do {
            puVar19 = puVar18;
            puVar7 = __src;
            __src = (ushort *)((long)puVar7 + 1);
            uVar8 = uVar8 + *(byte *)((long)puVar19 + -0xf);
            puVar11 = (ushort *)((long)puVar11 + 1);
            puVar18 = (ushort *)((long)puVar19 + 1);
          } while (puVar19 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar19 + -0xf) == 0xff);
          uVar23 = (ulong)uVar8 + 0xf;
          pbVar9 = __dest + uVar23;
          if ((CARRY8((ulong)__dest,uVar23)) || ((ulong)-(long)puVar11 < uVar23)) {
            __src = puVar19 + -7;
            goto LAB_001c6193;
          }
          uVar15 = (uint)bVar3;
          if (dest + (long)maxOutputSize + -0x20 < pbVar9) goto LAB_001c6287;
          puVar18 = (ushort *)((ulong)uVar8 + (long)puVar19 + 1);
          if (puVar1 + -0x10 < puVar18) {
            __src = puVar19 + -7;
            uVar15 = (uint)bVar3;
            goto LAB_001c6287;
          }
          lVar12 = 0;
          do {
            uVar5 = *(undefined8 *)((byte *)((long)__src + lVar12) + 8);
            pbVar22 = __dest + lVar12;
            *(undefined8 *)pbVar22 = *(undefined8 *)((long)__src + lVar12);
            *(undefined8 *)(pbVar22 + 8) = uVar5;
            pbVar10 = (byte *)((long)puVar7 + lVar12 + 0x11);
            uVar5 = *(undefined8 *)(pbVar10 + 8);
            *(undefined8 *)(pbVar22 + 0x10) = *(undefined8 *)pbVar10;
            *(undefined8 *)(pbVar22 + 0x18) = uVar5;
            lVar12 = lVar12 + 0x20;
          } while (pbVar22 + 0x20 < pbVar9);
        }
        else {
          pbVar9 = __dest + uVar23;
          uVar15 = (uint)bVar3;
          if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_001c6287;
          uVar5 = *(undefined8 *)((long)puVar18 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar5;
          puVar18 = (ushort *)(uVar23 + (long)__src);
        }
        uVar4 = *puVar18;
        uVar23 = (ulong)uVar4;
        __src = puVar18 + 1;
        pbVar22 = pbVar9 + -uVar23;
        uVar21 = (ulong)(bVar3 & 0xf);
        if (uVar21 == 0xf) break;
        __dest = pbVar9 + uVar21 + 4;
        uVar21 = uVar21 + 4;
        if (pbVar2 + -0x40 <= __dest) goto LAB_001c632a;
        if ((pbVar22 < pbVar14) || (uVar4 < 8)) goto LAB_001c605c;
        *(undefined8 *)pbVar9 = *(undefined8 *)pbVar22;
        *(undefined8 *)(pbVar9 + 8) = *(undefined8 *)(pbVar22 + 8);
        *(undefined2 *)(pbVar9 + 0x10) = *(undefined2 *)(pbVar22 + 0x10);
        puVar18 = __src;
      }
      if (pbVar22 < pbVar14) goto LAB_001c6193;
      uVar15 = 0;
      puVar18 = __src;
      do {
        __src = (ushort *)((long)puVar18 + 1);
        if (puVar1 + -2 <= __src) goto LAB_001c6193;
        uVar6 = *puVar18;
        uVar15 = uVar15 + (byte)uVar6;
        puVar18 = __src;
      } while ((byte)uVar6 == 0xff);
      uVar20 = (ulong)uVar15;
      if ((byte *)(-0x10 - uVar20) < pbVar9) goto LAB_001c6193;
      uVar21 = uVar20 + 0x13;
      if (pbVar9 + uVar20 + 0x13 < pbVar2 + -0x40) {
LAB_001c605c:
        if (pbVar22 < pbVar14) goto LAB_001c6193;
        __dest = pbVar9 + uVar21;
        puVar18 = __src;
        if (0xf < uVar4) {
          do {
            uVar5 = *(undefined8 *)(pbVar9 + -uVar23 + 8);
            *(undefined8 *)pbVar9 = *(undefined8 *)(pbVar9 + -uVar23);
            *(undefined8 *)(pbVar9 + 8) = uVar5;
            uVar5 = *(undefined8 *)(pbVar9 + -uVar23 + 0x10 + 8);
            *(undefined8 *)(pbVar9 + 0x10) = *(undefined8 *)(pbVar9 + -uVar23 + 0x10);
            *(undefined8 *)(pbVar9 + 0x18) = uVar5;
            pbVar9 = pbVar9 + 0x20;
          } while (pbVar9 < __dest);
          goto LAB_001c5ecd;
        }
        if (uVar23 == 4) {
          iVar16 = *(int *)pbVar22;
        }
        else if (uVar4 == 2) {
          iVar16 = CONCAT22(*(undefined2 *)pbVar22,*(undefined2 *)pbVar22);
        }
        else {
          if (uVar4 != 1) {
            if (uVar4 < 8) {
              pbVar9[0] = 0;
              pbVar9[1] = 0;
              pbVar9[2] = 0;
              pbVar9[3] = 0;
              *pbVar9 = *pbVar22;
              pbVar9[1] = pbVar22[1];
              pbVar9[2] = pbVar22[2];
              pbVar9[3] = pbVar22[3];
              uVar15 = inc32table[uVar4];
              *(undefined4 *)(pbVar9 + 4) = *(undefined4 *)(pbVar22 + uVar15);
              pbVar22 = pbVar22 + ((ulong)uVar15 - (long)dec64table[uVar4]);
            }
            else {
              *(undefined8 *)pbVar9 = *(undefined8 *)pbVar22;
              pbVar22 = pbVar22 + 8;
            }
            pbVar9 = pbVar9 + 8;
            do {
              *(undefined8 *)pbVar9 = *(undefined8 *)pbVar22;
              pbVar9 = pbVar9 + 8;
              pbVar22 = pbVar22 + 8;
            } while (pbVar9 < __dest);
            goto LAB_001c5ecd;
          }
          iVar16 = (uint)*pbVar22 * 0x1010101;
        }
        do {
          *(int *)pbVar9 = iVar16;
          *(int *)(pbVar9 + 4) = iVar16;
          pbVar9 = pbVar9 + 8;
        } while (pbVar9 < __dest);
        goto LAB_001c5ecd;
      }
LAB_001c632a:
      do {
        if (pbVar22 < pbVar14) {
LAB_001c6193:
          local_50 = (int)source;
          return ~(uint)__src + local_50;
        }
        __dest = pbVar9 + uVar21;
        if ((uint)uVar23 < 8) {
          pbVar9[0] = 0;
          pbVar9[1] = 0;
          pbVar9[2] = 0;
          pbVar9[3] = 0;
          *pbVar9 = *pbVar22;
          pbVar9[1] = pbVar22[1];
          pbVar9[2] = pbVar22[2];
          pbVar9[3] = pbVar22[3];
          uVar20 = (ulong)((uint)uVar23 << 2);
          uVar23 = (ulong)*(uint *)((long)inc32table + uVar20);
          *(undefined4 *)(pbVar9 + 4) = *(undefined4 *)(pbVar22 + uVar23);
          pbVar22 = pbVar22 + (uVar23 - (long)*(int *)((long)dec64table + uVar20));
        }
        else {
          *(undefined8 *)pbVar9 = *(undefined8 *)pbVar22;
          pbVar22 = pbVar22 + 8;
        }
        pbVar10 = pbVar9 + 8;
        puVar18 = __src;
        if (pbVar2 + -0xc < __dest) {
          if (pbVar2 + -5 < __dest) goto LAB_001c6193;
          pbVar9 = pbVar2 + -7;
          pbVar13 = pbVar22;
          pbVar17 = pbVar10;
          if (pbVar10 < pbVar9) {
            do {
              *(undefined8 *)pbVar17 = *(undefined8 *)pbVar13;
              pbVar17 = pbVar17 + 8;
              pbVar13 = pbVar13 + 8;
            } while (pbVar17 < pbVar9);
            pbVar22 = pbVar22 + ((long)pbVar9 - (long)pbVar10);
            pbVar10 = pbVar9;
          }
          for (; pbVar10 < __dest; pbVar10 = pbVar10 + 1) {
            bVar3 = *pbVar22;
            pbVar22 = pbVar22 + 1;
            *pbVar10 = bVar3;
          }
        }
        else {
          *(undefined8 *)pbVar10 = *(undefined8 *)pbVar22;
          if (0x10 < uVar21) {
            pbVar9 = pbVar9 + 0x10;
            do {
              pbVar22 = pbVar22 + 8;
              *(undefined8 *)pbVar9 = *(undefined8 *)pbVar22;
              pbVar9 = pbVar9 + 8;
            } while (pbVar9 < __dest);
          }
        }
LAB_001c6217:
        while( true ) {
          __src = (ushort *)((long)puVar18 + 1);
          bVar3 = (byte)*puVar18;
          uVar23 = (ulong)(uint)(bVar3 >> 4);
          if (bVar3 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) ||
             (dest + (long)maxOutputSize + -0x20 < __dest)) goto LAB_001c6283;
          uVar5 = *(undefined8 *)((long)puVar18 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar5;
          pbVar9 = __dest + uVar23;
          uVar21 = (ulong)(bVar3 & 0xf);
          puVar18 = (ushort *)((long)__src + uVar23);
          __src = puVar18 + 1;
          uVar4 = *puVar18;
          uVar23 = (ulong)uVar4;
          pbVar22 = pbVar9 + -uVar23;
          if (((uVar21 == 0xf) || (uVar4 < 8)) || (pbVar22 < pbVar14)) goto LAB_001c62d5;
          *(undefined8 *)pbVar9 = *(undefined8 *)pbVar22;
          *(undefined8 *)(pbVar9 + 8) = *(undefined8 *)(pbVar22 + 8);
          *(undefined2 *)(pbVar9 + 0x10) = *(undefined2 *)(pbVar22 + 0x10);
          __dest = pbVar9 + uVar21 + 4;
          puVar18 = __src;
        }
        if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_001c6193;
        puVar18 = puVar18 + 1;
        uVar15 = 0;
        do {
          uVar4 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar15 = uVar15 + (byte)uVar4;
          puVar18 = (ushort *)((long)puVar18 + 1);
        } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar4 == 0xff);
        uVar23 = (ulong)uVar15 + 0xf;
        if ((CARRY8((ulong)__dest,uVar23)) || ((ulong)-(long)puVar18 < uVar23)) goto LAB_001c6193;
LAB_001c6283:
        pbVar9 = __dest + uVar23;
        uVar15 = (uint)bVar3;
LAB_001c6287:
        puVar18 = (ushort *)((long)__src + uVar23);
        if ((pbVar2 + -0xc < pbVar9) || (puVar1 + -4 < puVar18)) {
          if ((puVar18 == puVar1) && (pbVar9 <= pbVar2)) {
            memmove(__dest,__src,uVar23);
            local_58 = (int)dest;
            return ((int)__dest + (int)uVar23) - local_58;
          }
          goto LAB_001c6193;
        }
        do {
          *(undefined8 *)__dest = *(undefined8 *)__src;
          __dest = __dest + 8;
          __src = __src + 4;
        } while (__dest < pbVar9);
        uVar23 = (ulong)*puVar18;
        __src = puVar18 + 1;
        pbVar22 = pbVar9 + -uVar23;
        uVar21 = (ulong)(uVar15 & 0xf);
LAB_001c62d5:
        if ((int)uVar21 == 0xf) {
          uVar15 = 0;
          do {
            uVar4 = *__src;
            __src = (ushort *)((long)__src + 1);
            uVar15 = uVar15 + (byte)uVar4;
          } while ((byte)uVar4 == 0xff && __src < puVar1 + -2);
          uVar21 = (ulong)uVar15 + 0xf;
          if ((puVar1 + -2 <= __src) || (CARRY8((ulong)pbVar9,uVar21))) goto LAB_001c6193;
        }
        uVar21 = uVar21 + 4;
      } while( true );
    }
  }
  return iVar16;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}